

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

string * __thiscall
libaom_examples::(anonymous_namespace)::format_color_properties_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          pair<libaom_examples::ColorProperties,_bool> *color_properties)

{
  undefined8 *puVar1;
  _anonymous_namespace_ _Var2;
  long lVar3;
  long *plVar4;
  string *extraout_RAX;
  undefined8 *puVar5;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  string *psVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  uint uVar10;
  string __str_1;
  string __str_2;
  string __str;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  string *local_d0;
  long local_c8;
  string local_c0;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  char *local_50 [2];
  char local_40 [16];
  
  if (this[4] == (_anonymous_namespace_)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"absent","");
    return extraout_RAX;
  }
  _Var2 = this[1];
  uVar10 = 1;
  if (9 < (byte)_Var2) {
    uVar10 = 3 - ((byte)_Var2 < 100);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],uVar10,(uint)(byte)_Var2);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_100 = *puVar7;
    lStack_f8 = plVar4[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar7;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  _Var2 = this[2];
  uVar10 = 1;
  if (9 < (byte)_Var2) {
    uVar10 = 3 - ((byte)_Var2 < 100);
  }
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0,uVar10,(uint)(byte)_Var2);
  uVar9 = 0xf;
  if (local_110 != &local_100) {
    uVar9 = local_100;
  }
  if (uVar9 < (ulong)(local_e8 + local_108)) {
    uVar9 = 0xf;
    if (local_f0 != local_e0) {
      uVar9 = local_e0[0];
    }
    if (uVar9 < (ulong)(local_e8 + local_108)) goto LAB_001271cb;
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001271cb:
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
  }
  local_d0 = &local_c0;
  psVar6 = (string *)(plVar4 + 2);
  if ((string *)*plVar4 == psVar6) {
    local_c0._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
    local_c0._M_string_length = plVar4[3];
  }
  else {
    local_c0._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
    local_d0 = (string *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)&(psVar6->_M_dataplus)._M_p = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_80 = *puVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar7;
    local_90 = (ulong *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  _Var2 = this[3];
  uVar10 = 1;
  if (9 < (byte)_Var2) {
    uVar10 = 3 - ((byte)_Var2 < 100);
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_70,uVar10,(uint)(byte)_Var2);
  uVar9 = 0xf;
  if (local_90 != &local_80) {
    uVar9 = local_80;
  }
  if (uVar9 < (ulong)(local_68 + local_88)) {
    uVar9 = 0xf;
    if (local_70 != local_60) {
      uVar9 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_00127353;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_00127353:
  local_c0.field_2._M_allocated_capacity = (size_type)&local_a0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *puVar1;
    local_c0.field_2._M_allocated_capacity = (size_type)(undefined8 *)*puVar5;
  }
  local_c0.field_2._8_8_ = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_c0.field_2._M_local_buf);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined8 *)local_c0.field_2._M_allocated_capacity != &local_a0) {
    operator_delete((void *)local_c0.field_2._M_allocated_capacity);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  psVar6 = &local_c0;
  if (local_d0 != psVar6) {
    operator_delete(local_d0);
    psVar6 = extraout_RAX_00;
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
    psVar6 = extraout_RAX_01;
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
    psVar6 = extraout_RAX_02;
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
    psVar6 = extraout_RAX_03;
  }
  return psVar6;
}

Assistant:

std::string format_color_properties(
    const std::pair<ColorProperties, bool> &color_properties) {
  if (!color_properties.second) {
    return "absent";
  } else {
    return std::to_string(color_properties.first.color_primaries) + "/" +
           std::to_string(color_properties.first.transfer_characteristics) +
           "/" + std::to_string(color_properties.first.matrix_coefficients) +
           (color_properties.first.color_range ? "F" : "L");
  }
}